

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Functional::VertexCubeTextureCase::iterate(VertexCubeTextureCase *this)

{
  ChannelOrder CVar1;
  ChannelType CVar2;
  uint height;
  uint uVar3;
  GLuint program;
  TextureCube *pTVar4;
  RenderContext *context;
  undefined4 uVar5;
  uint *puVar6;
  VertexCubeTextureCase *pVVar7;
  bool bVar8;
  int i;
  deUint32 dVar9;
  int iVar10;
  GLuint GVar11;
  GLint GVar12;
  RenderTarget *pRVar13;
  long lVar14;
  char *description;
  unsigned_short uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  unsigned_short uVar19;
  int i_1;
  long lVar20;
  ulong uVar21;
  ConstPixelBufferAccess *data;
  int iy;
  ulong uVar22;
  undefined1 *puVar23;
  int i_2;
  int iVar24;
  int iVar25;
  ulong uVar26;
  unsigned_short uVar27;
  int iVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  Vector<float,_2> res_2;
  Surface resImage;
  Vector<float,_2> res_1;
  Vec3 texCoord;
  Vec2 safeFaceCoord;
  Vector<float,_3> res_8;
  Vector<float,_2> result;
  Vec3 coordAB;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> quadColors;
  Vec2 rawFaceCoord;
  Vec3 coordAC;
  Vec2 quadVertices [4];
  Vector<float,_3> res_9;
  Vector<float,_3> res_7;
  Surface refImage;
  Random rnd;
  undefined1 local_2d0 [12];
  float fStack_2c4;
  int local_2bc;
  float local_2b8;
  float local_2b4;
  undefined1 local_2b0 [8];
  ConstPixelBufferAccess *local_2a8;
  ConstPixelBufferAccess *pCStack_2a0;
  long local_298;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> vStack_290;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_278;
  ulong local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  value_type local_248;
  int local_238;
  CubeFace local_234;
  undefined8 local_230;
  float local_228 [4];
  float local_218 [2];
  undefined8 uStack_210;
  undefined8 local_208;
  ulong local_200;
  undefined1 local_1f8 [8];
  pointer local_1f0;
  CubeFace local_1e8;
  undefined4 uStack_1e4;
  uint *local_1e0;
  ulong local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined4 local_1c0;
  int local_1bc;
  undefined1 local_1b8 [12];
  float fStack_1ac;
  undefined8 local_1a8;
  float local_1a0;
  CompareMode local_19c;
  ulong local_170;
  ulong local_168;
  VertexCubeTextureCase *local_160;
  ulong local_158;
  ulong local_150;
  int local_148 [4];
  float local_138 [4];
  float local_128 [4];
  ulong local_118;
  ulong local_110;
  long local_108;
  ulong local_100;
  ulong local_f8;
  Surface local_f0;
  undefined1 local_d8 [20];
  Vec2 local_c4 [2];
  int local_b4;
  ChannelType local_b0;
  int local_ac;
  int local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  ChannelOrder local_90;
  int local_8c;
  int local_88;
  int local_84;
  undefined4 local_80;
  undefined1 *local_7c;
  undefined8 uStack_74;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  deRandom local_40;
  
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar10 = 0xa8;
  if (pRVar13->m_width < 0xa8) {
    iVar10 = pRVar13->m_width;
  }
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_110 = 0x70;
  if (pRVar13->m_height < 0x70) {
    local_110 = (ulong)(uint)pRVar13->m_height;
  }
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar17 = pRVar13->m_width;
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar24 = pRVar13->m_height;
  dVar9 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&local_40,dVar9);
  dVar9 = deRandom_getUint32(&local_40);
  local_168 = (ulong)dVar9 % (ulong)((iVar17 - iVar10) + 1);
  dVar9 = deRandom_getUint32(&local_40);
  iVar17 = (int)local_110;
  local_170 = (ulong)dVar9 % (ulong)((iVar24 - iVar17) + 1);
  glwUseProgram((this->m_program->m_program).m_program);
  uVar26 = (ulong)(uint)(iVar10 / 2);
  uVar21 = (ulong)(uint)((int)(local_110 >> 0x1f) + iVar17 >> 1);
  glwClearColor(0.125,0.25,0.5,1.0);
  glwClear(0x4000);
  tcu::Surface::Surface(&local_f0,iVar10,iVar17);
  local_1bc = iVar17 + 3;
  if (-1 < iVar17) {
    local_1bc = iVar17;
  }
  local_1bc = local_1bc >> 2;
  uVar22 = 0;
  local_160 = this;
  local_150 = uVar26;
  local_158 = uVar21;
  local_118 = (ulong)(uint)(iVar10 / 6);
  local_238 = iVar10;
  do {
    local_234 = (CubeFace)uVar22;
    iVar10 = (int)local_118;
    local_d8._0_4_ = (local_234 + (int)(uVar22 / 3) * -3) * iVar10;
    local_d8._4_4_ = (int)(uVar22 / 3) * local_1bc;
    local_b4 = local_d8._0_4_ + (int)uVar26;
    local_8c = local_d8._4_4_ + (int)uVar21;
    local_ac = local_238 - local_b4;
    local_d8._8_4_ = (int)uVar26 - local_d8._0_4_;
    if (local_234 != CUBEFACE_POSITIVE_Z && local_234 != CUBEFACE_NEGATIVE_Y) {
      local_ac = iVar10;
      local_d8._8_4_ = iVar10;
    }
    local_d8._12_4_ = (int)uVar21 - local_d8._4_4_;
    if (local_234 < CUBEFACE_POSITIVE_Y) {
      local_d8._12_4_ = local_1bc;
    }
    local_d8._16_4_ = 0;
    local_c4[0].m_data = (float  [2])&DAT_3f8000003f800000;
    local_c4[1].m_data = (float  [2])0x0;
    local_b0 = local_d8._4_4_;
    local_a8 = local_d8._12_4_;
    local_a4 = 0;
    local_a0 = 0x3e99999a;
    uStack_9c = 0x3e99999a;
    uStack_98 = 0x3f000000;
    uStack_94 = 0x3e99999a;
    local_90 = local_d8._0_4_;
    local_88 = local_d8._8_4_;
    local_84 = (int)local_110 - local_8c;
    if (local_234 < CUBEFACE_POSITIVE_Y) {
      local_84 = local_1bc;
    }
    local_80 = 1;
    local_7c = &DAT_3f8000003f800000;
    uStack_74 = 0;
    local_6c = local_b4;
    local_68 = local_8c;
    local_64 = local_ac;
    local_60 = local_84;
    local_5c = 1;
    local_58 = 0x3e99999a;
    uStack_54 = 0x3e99999a;
    uStack_50 = 0x3f000000;
    uStack_4c = 0x3e99999a;
    lVar20 = 0;
    do {
      local_108 = lVar20;
      lVar20 = lVar20 * 0x24;
      local_1e0 = (uint *)(local_d8 + lVar20);
      CVar1 = *(ChannelOrder *)(local_d8 + lVar20 + 8);
      CVar2 = *(ChannelType *)((long)local_c4 + lVar20 + -8);
      local_1b8._4_4_ = CVar2;
      local_1b8._0_4_ = CVar1;
      local_2b0._0_4_ = 0.0;
      local_2b0._4_4_ = 0.0;
      lVar14 = 0;
      do {
        *(float *)(local_2b0 + lVar14 * 4) = (float)*(int *)(local_1b8 + lVar14 * 4);
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      iVar10 = *(int *)((long)local_c4 + lVar20 + -4);
      local_2b4 = calculateLod(this,(Vec2 *)((long)local_c4 + lVar20),(Vec2 *)local_2b0,iVar10);
      local_2bc = *(int *)((long)this->m_textures + (ulong)(local_2b4 <= 0.0) * 4 + -0x18);
      local_148[2] = CVar1;
      local_148[3] = CVar2;
      local_148[0] = (this->m_textures[iVar10]->m_refTexture).m_size;
      local_148[1] = local_148[0];
      local_1f8 = (undefined1  [8])*(pointer *)((long)local_c4 + lVar20);
      local_1f0 = *(pointer *)((long)local_c4 + lVar20 + 8);
      local_1e8 = local_234;
      local_2b0._0_4_ = 8.82818e-44;
      local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (unsigned_short *)0x0;
      vStack_290.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_290.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_298 = 0;
      vStack_290.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2a8 = (ConstPixelBufferAccess *)0x0;
      pCStack_2a0 = (ConstPixelBufferAccess *)0x0;
      local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (unsigned_short *)0x0;
      std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::reserve
                ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                 &local_2a8,0x3e04);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
                (&local_278,(long)(local_2b0._0_4_ * local_2b0._0_4_ * 6));
      if (0 < (int)local_2b0._0_4_) {
        local_260 = 0;
        do {
          if (0 < (int)local_2b0._0_4_) {
            local_2b8 = (float)(int)local_260 / 63.0;
            local_1d8 = CONCAT44(local_1d8._4_4_,(float)((int)local_260 + 1) / 63.0);
            iVar10 = 0;
            do {
              fVar29 = (float)iVar10;
              iVar10 = iVar10 + 1;
              local_1b8._4_4_ = local_2b8;
              local_1b8._0_4_ = fVar29 / 63.0;
              stack0xfffffffffffffe50 = (pointer)CONCAT44(local_2b8,(float)iVar10 / 63.0);
              local_1a8 = (pointer)CONCAT44((CompareMode)local_1d8,fVar29 / 63.0);
              local_1a0 = (float)iVar10 / 63.0;
              uVar16 = (int)pCStack_2a0 - (int)local_2a8;
              local_19c = (CompareMode)local_1d8;
              puVar23 = local_1b8;
              lVar20 = 0;
              do {
                local_208 = 0;
                local_218[0] = 0.0;
                local_218[1] = 0.0;
                lVar14 = 0;
                do {
                  fVar29 = *(float *)((long)&local_208 + lVar14 * 4);
                  iVar17 = local_148[lVar14 + 2];
                  fVar31 = (*(float *)(puVar23 + lVar14 * 4) * (float)iVar17 + 0.5) - fVar29;
                  fVar30 = floorf(fVar31);
                  local_218[lVar14] =
                       ((fVar31 - fVar30) * 0.5 + fVar30 + 0.25 + -0.5 + fVar29) / (float)iVar17;
                  lVar14 = lVar14 + 1;
                } while (lVar14 == 1);
                local_258 = 0;
                lVar14 = 0;
                do {
                  *(float *)((long)&local_258 + lVar14 * 4) = local_218[lVar14] + local_218[lVar14];
                  lVar14 = lVar14 + 1;
                } while (lVar14 == 1);
                local_2d0._0_4_ = 0.0;
                local_2d0._4_4_ = 0.0;
                lVar14 = 0;
                do {
                  *(float *)(local_2d0 + lVar14 * 4) =
                       *(float *)((long)&local_258 + lVar14 * 4) + -1.0;
                  lVar14 = lVar14 + 1;
                } while (lVar14 == 1);
                std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
                emplace_back<tcu::Vector<float,2>>
                          ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)
                           &local_2a8,(Vector<float,_2> *)local_2d0);
                lVar20 = lVar20 + 1;
                puVar23 = puVar23 + 8;
              } while (lVar20 != 4);
              uVar15 = (unsigned_short)(uVar16 >> 3);
              if (local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                local_2d0._0_2_ = uVar15;
                std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                _M_realloc_insert<unsigned_short>
                          (&local_278,
                           (iterator)
                           local_278.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(unsigned_short *)local_2d0);
              }
              else {
                *local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish = uVar15;
                local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              uVar27 = uVar15 + 1;
              if (local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                local_2d0._0_2_ = uVar27;
                std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                _M_realloc_insert<unsigned_short>
                          (&local_278,
                           (iterator)
                           local_278.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(unsigned_short *)local_2d0);
              }
              else {
                *local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish = uVar27;
                local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              uVar19 = uVar15 + 2;
              if (local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                local_2d0._0_2_ = uVar19;
                std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                _M_realloc_insert<unsigned_short>
                          (&local_278,
                           (iterator)
                           local_278.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(unsigned_short *)local_2d0);
              }
              else {
                *local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish = uVar19;
                local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              if (local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                local_2d0._0_2_ = uVar27;
                std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                _M_realloc_insert<unsigned_short>
                          (&local_278,
                           (iterator)
                           local_278.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(unsigned_short *)local_2d0);
              }
              else {
                *local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish = uVar27;
                local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              local_2d0._0_2_ = uVar15 + 3;
              if (local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                _M_realloc_insert<unsigned_short>
                          (&local_278,
                           (iterator)
                           local_278.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(unsigned_short *)local_2d0);
              }
              else {
                *local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish = local_2d0._0_2_;
                local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              local_2d0._0_2_ = uVar19;
              if (local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                _M_realloc_insert<unsigned_short>
                          (&local_278,
                           (iterator)
                           local_278.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(unsigned_short *)local_2d0);
              }
              else {
                *local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish = uVar19;
                local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
            } while (iVar10 < (int)local_2b0._0_4_);
          }
          uVar16 = (int)local_260 + 1;
          local_260 = (ulong)uVar16;
        } while ((int)uVar16 < (int)local_2b0._0_4_);
      }
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::reserve
                (&vStack_290,(long)(local_2b0._0_4_ * local_2b0._0_4_ * 4));
      fVar29 = (float)(int)local_2b0._0_4_;
      local_1b8._0_4_ = R;
      local_1b8._4_4_ = SNORM_INT8;
      stack0xfffffffffffffe50 = (pointer)0x0;
      local_1a8 = (pointer)0x0;
      glu::TextureTestUtil::computeQuadTexCoordCube
                ((vector<float,_std::allocator<float>_> *)local_1b8,local_1e8);
      pVVar7 = local_160;
      local_2d0._0_8_ = *(float (*) [2])local_1b8._0_8_;
      local_2d0._8_4_ = (*(float (*) [2])(local_1b8._0_8_ + 8))[0];
      local_258 = *(undefined8 *)(local_1b8._0_8_ + 0xc);
      uStack_250 = CONCAT44(uStack_250._4_4_,*(float *)(local_1b8._0_8_ + 0x14));
      local_218 = *(float (*) [2])(local_1b8._0_8_ + 0x18);
      uStack_210 = CONCAT44(uStack_210._4_4_,(*(float (*) [2])(local_1b8._0_8_ + 0x20))[0]);
      local_200 = local_200 & 0xffffffff00000000;
      local_208 = 0;
      lVar20 = 0;
      do {
        *(float *)((long)&local_208 + lVar20 * 4) =
             *(float *)((long)&local_258 + lVar20 * 4) - *(float *)(local_2d0 + lVar20 * 4);
        lVar20 = lVar20 + 1;
      } while (lVar20 != 3);
      local_1c0 = 0;
      local_1c8 = 0;
      lVar20 = 0;
      do {
        *(float *)((long)&local_1c8 + lVar20 * 4) =
             local_218[lVar20] - *(float *)(local_2d0 + lVar20 * 4);
        lVar20 = lVar20 + 1;
      } while (lVar20 != 3);
      if (0 < (int)local_2b0._0_4_) {
        iVar10 = 0;
        do {
          if (0 < (int)local_2b0._0_4_) {
            local_2b8 = (float)iVar10 / fVar29;
            iVar17 = 0;
            do {
              local_228[1] = local_2b8;
              local_228[0] = (float)iVar17 / fVar29;
              local_248.m_data[0] = 0.0;
              local_248.m_data[1] = 0.0;
              lVar20 = 0;
              do {
                local_248.m_data[lVar20] = *(float *)(local_1f8 + lVar20 * 4) * local_228[lVar20];
                lVar20 = lVar20 + 1;
              } while (lVar20 == 1);
              local_1d0 = 0;
              lVar20 = 0;
              do {
                *(float *)((long)&local_1d0 + lVar20 * 4) =
                     local_248.m_data[lVar20] + *(float *)((long)&local_1f0 + lVar20 * 4);
                lVar20 = lVar20 + 1;
              } while (lVar20 == 1);
              if (((local_2bc == 0x2600) || (local_2bc == 0x2700)) || (local_2bc == 0x2702)) {
                lVar20 = 0;
                do {
                  local_248.m_data[lVar20] = 0.5;
                  lVar20 = lVar20 + 1;
                } while (lVar20 == 1);
                local_230 = 0;
                lVar20 = 0;
                do {
                  fVar30 = local_248.m_data[lVar20];
                  iVar24 = local_148[lVar20];
                  fVar32 = (*(float *)((long)&local_1d0 + lVar20 * 4) * (float)iVar24 + 0.5) -
                           fVar30;
                  fVar31 = floorf(fVar32);
                  *(float *)((long)&local_230 + lVar20 * 4) =
                       ((fVar32 - fVar31) * 0.5 + fVar31 + 0.25 + -0.5 + fVar30) / (float)iVar24;
                  lVar20 = lVar20 + 1;
                } while (lVar20 == 1);
              }
              else {
                local_230 = local_1d0;
              }
              local_128[0] = 0.0;
              local_128[1] = 0.0;
              local_128[2] = 0.0;
              lVar20 = 0;
              do {
                local_128[lVar20] = *(float *)((long)&local_1c8 + lVar20 * 4) * (float)local_230;
                lVar20 = lVar20 + 1;
              } while (lVar20 != 3);
              local_228[2] = 0.0;
              local_228[0] = 0.0;
              local_228[1] = 0.0;
              lVar20 = 0;
              do {
                local_228[lVar20] = *(float *)(local_2d0 + lVar20 * 4) + local_128[lVar20];
                lVar20 = lVar20 + 1;
              } while (lVar20 != 3);
              local_138[0] = 0.0;
              local_138[1] = 0.0;
              local_138[2] = 0.0;
              lVar20 = 0;
              do {
                local_138[lVar20] = *(float *)((long)&local_208 + lVar20 * 4) * local_230._4_4_;
                lVar20 = lVar20 + 1;
              } while (lVar20 != 3);
              local_248.m_data[2] = 0.0;
              local_248.m_data[0] = 0.0;
              local_248.m_data[1] = 0.0;
              lVar20 = 0;
              do {
                local_248.m_data[lVar20] = local_228[lVar20] + local_138[lVar20];
                lVar20 = lVar20 + 1;
              } while (lVar20 != 3);
              iVar24 = 4;
              do {
                std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                push_back(&vStack_290,&local_248);
                iVar24 = iVar24 + -1;
              } while (iVar24 != 0);
              iVar17 = iVar17 + 1;
            } while (iVar17 < (int)local_2b0._0_4_);
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < (int)local_2b0._0_4_);
      }
      if ((TextureFormat)local_1b8._0_8_ != (TextureFormat)0x0) {
        operator_delete((void *)local_1b8._0_8_,(long)local_1a8 - local_1b8._0_8_);
      }
      puVar6 = local_1e0;
      local_f8 = (ulong)*local_1e0;
      local_100 = (ulong)local_1e0[1];
      uVar16 = local_1e0[2];
      height = local_1e0[3];
      glwViewport(*local_1e0 + (int)local_168,local_1e0[1] + (int)local_170,uVar16,height);
      uVar3 = puVar6[4];
      program = (pVVar7->m_program->m_program).m_program;
      GVar11 = glwGetAttribLocation(program,"a_position");
      if (GVar11 != 0xffffffff) {
        glwEnableVertexAttribArray(GVar11);
        glwVertexAttribPointer(GVar11,2,0x1406,'\0',0,local_2a8);
      }
      GVar11 = glwGetAttribLocation(program,"a_texCoord");
      if (GVar11 != 0xffffffff) {
        glwEnableVertexAttribArray(GVar11);
        glwVertexAttribPointer
                  (GVar11,3,0x1406,'\0',0,
                   vStack_290.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      GVar12 = glwGetUniformLocation(program,"u_lod");
      if (GVar12 != -1) {
        glwUniform1f(GVar12,local_2b4);
      }
      glwActiveTexture(0x84c0);
      glwBindTexture(0x8513,pVVar7->m_textures[(int)uVar3]->m_glTexture);
      glwTexParameteri(0x8513,0x2802,pVVar7->m_wrapS);
      glwTexParameteri(0x8513,0x2803,pVVar7->m_wrapT);
      glwTexParameteri(0x8513,0x2801,pVVar7->m_minFilter);
      glwTexParameteri(0x8513,0x2800,pVVar7->m_magFilter);
      GVar12 = glwGetUniformLocation(program,"u_texture");
      if (GVar12 != -1) {
        glwUniform1i(GVar12,0);
      }
      glwDrawElements(4,local_2b0._0_4_ * local_2b0._0_4_ * 6,0x1403,
                      local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_start);
      glu::mapGLSampler((Sampler *)local_1b8,pVVar7->m_wrapS,pVVar7->m_wrapT,pVVar7->m_minFilter,
                        pVVar7->m_magFilter);
      pTVar4 = pVVar7->m_textures[(int)uVar3];
      uVar5 = local_2b0._0_4_;
      uVar21 = (ulong)local_2b0 & 0xffffffff;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_1f8
                 ,(long)(int)(local_2b0._0_4_ * local_2b0._0_4_),(allocator_type *)local_2d0);
      if (0 < (int)uVar5) {
        lVar20 = 0;
        fVar29 = 0.0;
        do {
          uVar26 = 0;
          do {
            iVar10 = (local_2b0._0_4_ * (int)fVar29 + (int)uVar26) * 4;
            tcu::TextureCubeView::sample
                      ((TextureCubeView *)local_2d0,(Sampler *)&(pTVar4->m_refTexture).m_view,
                       vStack_290.
                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data[0],
                       vStack_290.
                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data[1],
                       vStack_290.
                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data[2],local_2b4);
            *(undefined8 *)
             ((pointer)((long)local_1f8 + (long)((int)uVar26 + (int)lVar20) * 0x10))->m_data =
                 local_2d0._0_8_;
            *(ulong *)(((pointer)((long)local_1f8 + (long)((int)uVar26 + (int)lVar20) * 0x10))->
                       m_data + 2) = CONCAT44(fStack_2c4,local_2d0._8_4_);
            uVar26 = uVar26 + 1;
          } while (uVar21 != uVar26);
          fVar29 = (float)((int)fVar29 + 1);
          lVar20 = lVar20 + uVar21;
        } while (fVar29 != (float)uVar5);
      }
      local_260 = (ulong)(int)local_2b0._0_4_;
      if (0 < (long)local_260) {
        fVar30 = (float)(int)uVar16;
        local_2b4 = (float)(int)height;
        fVar29 = 0.0;
        local_2bc = 0;
        do {
          local_1e0 = (uint *)CONCAT44(local_1e0._4_4_,fVar29);
          uVar21 = 0;
          do {
            lVar20 = 0;
            do {
              *(float *)(local_2d0 + lVar20 * 4) =
                   ((pointer)((long)local_1f8 + (long)(int)fVar29 * 0x10))->m_data[lVar20];
              lVar20 = lVar20 + 1;
            } while (lVar20 != 4);
            iVar10 = local_2b0._0_4_ * local_2bc + (int)uVar21;
            local_208 = *(undefined8 *)((local_2a8->m_size).m_data + (long)(iVar10 * 4) * 2 + -2);
            local_200 = *(ulong *)((local_2a8->m_size).m_data + (long)(iVar10 * 4 + 3) * 2 + -2);
            local_218[0] = 0.0;
            local_218[1] = 0.0;
            uStack_210 = 0;
            lVar20 = 0;
            do {
              local_218[lVar20] = *(float *)((long)&local_208 + lVar20 * 4) * 0.5;
              lVar20 = lVar20 + 1;
            } while (lVar20 != 4);
            local_258 = 0;
            uStack_250 = 0;
            lVar20 = 0;
            do {
              *(float *)((long)&local_258 + lVar20 * 4) = local_218[lVar20] + 0.5;
              lVar20 = lVar20 + 1;
            } while (lVar20 != 4);
            local_2b8 = fVar29;
            local_1d8 = uVar21;
            fVar29 = ceilf((float)local_258 * fVar30 + -0.5);
            fVar31 = ceilf((float)uStack_250 * fVar30 + -0.5);
            fVar32 = ceilf(local_258._4_4_ * local_2b4 + -0.5);
            iVar10 = (int)fVar32;
            fVar32 = ceilf(uStack_250._4_4_ * local_2b4 + -0.5);
            if (iVar10 < (int)fVar32) {
              iVar24 = (int)fVar29;
              iVar25 = (int)local_100 + iVar10;
              iVar17 = (int)local_f8;
              do {
                iVar28 = iVar17 + iVar24;
                iVar18 = (int)fVar31 - iVar24;
                if (iVar24 < (int)fVar31) {
                  do {
                    tcu::RGBA::RGBA((RGBA *)&local_1c8,(Vec4 *)local_2d0);
                    *(deUint32 *)
                     ((long)local_f0.m_pixels.m_ptr + (long)(local_f0.m_width * iVar25 + iVar28) * 4
                     ) = local_1c8._0_4_;
                    iVar28 = iVar28 + 1;
                    iVar18 = iVar18 + -1;
                  } while (iVar18 != 0);
                }
                iVar10 = iVar10 + 1;
                iVar25 = iVar25 + 1;
              } while (iVar10 != (int)fVar32);
            }
            uVar21 = local_1d8 + 1;
            fVar29 = (float)((int)local_2b8 + 1);
          } while (uVar21 != local_260);
          local_2bc = local_2bc + 1;
          fVar29 = (float)((int)local_1e0 + (int)local_260);
        } while (local_2bc != (int)local_260);
      }
      uVar26 = local_150;
      uVar21 = local_158;
      if (local_1f8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1f8,CONCAT44(uStack_1e4,local_1e8) - (long)local_1f8);
      }
      if (local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_278.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_278.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_278.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      this = local_160;
      if (vStack_290.
          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_290.
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)vStack_290.
                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vStack_290.
                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2a8 != (ConstPixelBufferAccess *)0x0) {
        operator_delete(local_2a8,local_298 - (long)local_2a8);
      }
      lVar20 = local_108 + 1;
    } while (lVar20 != 4);
    uVar22 = (ulong)(local_234 + CUBEFACE_POSITIVE_X);
  } while (local_234 + CUBEFACE_POSITIVE_X != 6);
  tcu::Surface::Surface((Surface *)local_2b0,local_238,(int)local_110);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_1b8._0_4_ = RGBA;
  local_1b8._4_4_ = UNORM_INT8;
  data = pCStack_2a0;
  if (pCStack_2a0 != (ConstPixelBufferAccess *)0x0) {
    data = local_2a8;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_d8,(TextureFormat *)local_1b8,local_2b0._0_4_,
             local_2b0._4_4_,1,data);
  glu::readPixels(context,(int)local_168,(int)local_170,(PixelBufferAccess *)local_d8);
  glwUseProgram(0);
  bVar8 = compareImages(((this->super_TestCase).m_context)->m_renderCtx,
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        &local_f0,(Surface *)local_2b0);
  description = "Image comparison failed";
  if (bVar8) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar8,description
            );
  tcu::Surface::~Surface((Surface *)local_2b0);
  tcu::Surface::~Surface(&local_f0);
  return STOP;
}

Assistant:

VertexCubeTextureCase::IterateResult VertexCubeTextureCase::iterate (void)
{
	const int	viewportWidth		= deMin32(m_context.getRenderTarget().getWidth(), MAX_CUBE_RENDER_WIDTH);
	const int	viewportHeight		= deMin32(m_context.getRenderTarget().getHeight(), MAX_CUBE_RENDER_HEIGHT);

	const int	viewportXOffsetMax	= m_context.getRenderTarget().getWidth() - viewportWidth;
	const int	viewportYOffsetMax	= m_context.getRenderTarget().getHeight() - viewportHeight;

	de::Random	rnd					(deStringHash(getName()));

	const int	viewportXOffset		= rnd.getInt(0, viewportXOffsetMax);
	const int	viewportYOffset		= rnd.getInt(0, viewportYOffsetMax);

	glUseProgram(m_program->getProgram());

	// Divide viewport into 4 areas.
	const int leftWidth		= viewportWidth / 2;
	const int rightWidth	= viewportWidth - leftWidth;
	const int bottomHeight	= viewportHeight / 2;
	const int topHeight		= viewportHeight - bottomHeight;

	// Clear.
	glClearColor(0.125f, 0.25f, 0.5f, 1.0f);
	glClear(GL_COLOR_BUFFER_BIT);

	// Texture scaling and offsetting vectors.
	const Vec2 texMinScale		(1.0f, 1.0f);
	const Vec2 texMinOffset		(0.0f, 0.0f);
	const Vec2 texMagScale		(0.3f, 0.3f);
	const Vec2 texMagOffset		(0.5f, 0.3f);

	// Surface for the reference image.
	tcu::Surface refImage(viewportWidth, viewportHeight);

	// Each of the four areas is divided into 6 cells.
	const int defCellWidth	= viewportWidth / 2 / 3;
	const int defCellHeight	= viewportHeight / 2 / 2;

	for (int i = 0; i < tcu::CUBEFACE_LAST; i++)
	{
		const int	cellOffsetX			= defCellWidth * (i % 3);
		const int	cellOffsetY			= defCellHeight * (i / 3);
		const bool	isRightmostCell		= i == 2 || i == 5;
		const bool	isTopCell			= i >= 3;
		const int	leftCellWidth		= isRightmostCell	? leftWidth		- cellOffsetX : defCellWidth;
		const int	rightCellWidth		= isRightmostCell	? rightWidth	- cellOffsetX : defCellWidth;
		const int	bottomCellHeight	= isTopCell			? bottomHeight	- cellOffsetY : defCellHeight;
		const int	topCellHeight		= isTopCell			? topHeight		- cellOffsetY : defCellHeight;

		const struct Render
		{
			const Rect	region;
			int			textureNdx;
			const Vec2	texCoordScale;
			const Vec2	texCoordOffset;
			Render (const Rect& r, int tN, const Vec2& tS, const Vec2& tO) : region(r), textureNdx(tN), texCoordScale(tS), texCoordOffset(tO) {}
		} renders[] =
		{
			Render(Rect(cellOffsetX + 0,			cellOffsetY + 0,				leftCellWidth,	bottomCellHeight),	0, texMinScale, texMinOffset),
			Render(Rect(cellOffsetX + leftWidth,	cellOffsetY + 0,				rightCellWidth,	bottomCellHeight),	0, texMagScale, texMagOffset),
			Render(Rect(cellOffsetX + 0,			cellOffsetY + bottomHeight,		leftCellWidth,	topCellHeight),		1, texMinScale, texMinOffset),
			Render(Rect(cellOffsetX + leftWidth,	cellOffsetY + bottomHeight,		rightCellWidth,	topCellHeight),		1, texMagScale, texMagOffset)
		};

		for (int renderNdx = 0; renderNdx < DE_LENGTH_OF_ARRAY(renders); renderNdx++)
		{
			const Render&	rend				= renders[renderNdx];
			const float		lod					= calculateLod(rend.texCoordScale, rend.region.size().asFloat(), rend.textureNdx);
			const bool		useSafeTexCoords	= isLevelNearest(lod > 0.0f ? m_minFilter : m_magFilter);
			const Grid		grid				(GRID_SIZE_CUBE, rend.region.size(), getTextureSize(*m_textures[rend.textureNdx]),
												 TexTypeCoordParams<TEXTURETYPE_CUBE>(rend.texCoordScale, rend.texCoordOffset, (tcu::CubeFace)i), useSafeTexCoords);

			glViewport(viewportXOffset + rend.region.x, viewportYOffset + rend.region.y, rend.region.w, rend.region.h);
			renderCell				(rend.textureNdx, lod, grid);
			computeReferenceCell	(rend.textureNdx, lod, grid, refImage, rend.region);
		}
	}

	// Read back rendered results.
	tcu::Surface resImage(viewportWidth, viewportHeight);
	glu::readPixels(m_context.getRenderContext(), viewportXOffset, viewportYOffset, resImage.getAccess());

	glUseProgram(0);

	// Compare and log.
	{
		const bool isOk = compareImages(m_context.getRenderContext(), m_testCtx.getLog(), refImage, resImage);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Image comparison failed");
	}

	return STOP;
}